

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGlaOld.c
# Opt level: O1

Rfn_Obj_t * Gla_ObjRef(Gla_Man_t *p,Gia_Obj_t *pObj,int f)

{
  Gia_Obj_t *pGVar1;
  Vec_Int_t *p_00;
  
  pGVar1 = p->pGia->pObjs;
  if ((pObj < pGVar1) || (pGVar1 + p->pGia->nObjs <= pObj)) {
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                  ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  p_00 = p->pvRefis + (int)((ulong)((long)pObj - (long)pGVar1) >> 2) * -0x55555555;
  Vec_IntFillExtra(p_00,f + 1,f);
  if ((-1 < f) && (f < p_00->nSize)) {
    return (Rfn_Obj_t *)(p_00->pArray + (uint)f);
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                ,0x1af,"int *Vec_IntEntryP(Vec_Int_t *, int)");
}

Assistant:

static inline Rfn_Obj_t * Gla_ObjRef( Gla_Man_t * p, Gia_Obj_t * pObj, int f ) { return (Rfn_Obj_t *)Vec_IntGetEntryP( &(p->pvRefis[Gia_ObjId(p->pGia, pObj)]), f ); }